

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicohandler.cpp
# Opt level: O0

ssize_t __thiscall QtIcoHandler::write(QtIcoHandler *this,int __fd,void *__buf,size_t __n)

{
  int __fd_00;
  ssize_t sVar1;
  size_t __n_00;
  long in_FS_OFFSET;
  QIODevice *device;
  QList<QImage> imgs;
  parameter_type in_stack_ffffffffffffffa8;
  QList<QImage> *this_00;
  QList<QImage> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __fd_00 = QImageIOHandler::device();
  local_28.d.size = -0x5555555555555556;
  local_28.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_28.d.ptr = (QImage *)0xaaaaaaaaaaaaaaaa;
  this_00 = &local_28;
  QList<QImage>::QList((QList<QImage> *)0x107f49);
  QList<QImage>::append(this_00,in_stack_ffffffffffffffa8);
  sVar1 = ICOReader::write(__fd_00,this_00,__n_00);
  QList<QImage>::~QList((QList<QImage> *)0x107f75);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),(char)sVar1) &
           0xffffffffffffff01;
  }
  __stack_chk_fail();
}

Assistant:

bool QtIcoHandler::write(const QImage &image)
{
    QIODevice *device = QImageIOHandler::device();
    QList<QImage> imgs;
    imgs.append(image);
    return ICOReader::write(device, imgs);
}